

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_consume_return_type(writer *w,method_signature *signature,bool delegate_types)

{
  bool bVar1;
  param_category pVar2;
  RetTypeSig *pRVar3;
  TypeSig *signature_00;
  RetTypeSig *args_2;
  string_view sVar4;
  string_view local_110;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  char *local_f0;
  char *format_3;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  char *local_c8;
  char *format_2;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  char *local_a0;
  char *format_1;
  char *local_90;
  string_view local_88;
  basic_string_view<char,_std::char_traits<char>_> local_78 [2];
  undefined1 local_58 [8];
  member_value_guard<bool> delegate_guard;
  member_value_guard<bool> abi_guard;
  char *format;
  param_category category;
  bool delegate_types_local;
  method_signature *signature_local;
  writer *w_local;
  
  pRVar3 = method_signature::return_signature(signature);
  bVar1 = winmd::reader::RetTypeSig::operator_cast_to_bool(pRVar3);
  if (bVar1) {
    pRVar3 = method_signature::return_signature(signature);
    signature_00 = winmd::reader::RetTypeSig::Type(pRVar3);
    pVar2 = get_category(signature_00,(TypeDef *)0x0);
    if (pVar2 == array_type) {
      writer::push_abi_types((member_value_guard<bool> *)&delegate_guard.previous,w,true);
      writer::push_delegate_types((member_value_guard<bool> *)local_58,w,delegate_types);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (local_78,"\n        uint32_t %_impl_size{};\n        %* %{};");
      local_88 = method_signature::return_param_name(signature);
      pRVar3 = method_signature::return_signature(signature);
      sVar4 = method_signature::return_param_name(signature);
      local_90 = sVar4._M_str;
      format_1 = (char *)sVar4._M_len;
      writer_base<cppwinrt::writer>::
      write<std::basic_string_view<char,std::char_traits<char>>,winmd::reader::RetTypeSig,std::basic_string_view<char,std::char_traits<char>>>
                (&w->super_writer_base<cppwinrt::writer>,local_78,&local_88,pRVar3,
                 (basic_string_view<char,_std::char_traits<char>_> *)&format_1);
      writer::member_value_guard<bool>::~member_value_guard((member_value_guard<bool> *)local_58);
      writer::member_value_guard<bool>::~member_value_guard
                ((member_value_guard<bool> *)&delegate_guard.previous);
    }
    else if ((pVar2 == object_type) || (pVar2 == string_type)) {
      local_a0 = "\n        void* %{};";
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_b0,"\n        void* %{};");
      _format_2 = method_signature::return_param_name(signature);
      writer_base<cppwinrt::writer>::write<std::basic_string_view<char,std::char_traits<char>>>
                (&w->super_writer_base<cppwinrt::writer>,&local_b0,
                 (basic_string_view<char,_std::char_traits<char>_> *)&format_2);
    }
    else if (pVar2 == generic_type) {
      local_c8 = "\n        % %{ empty_value<%>() };";
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_d8,"\n        % %{ empty_value<%>() };");
      pRVar3 = method_signature::return_signature(signature);
      _format_3 = method_signature::return_param_name(signature);
      args_2 = method_signature::return_signature(signature);
      writer_base<cppwinrt::writer>::
      write<winmd::reader::RetTypeSig,std::basic_string_view<char,std::char_traits<char>>,winmd::reader::RetTypeSig>
                (&w->super_writer_base<cppwinrt::writer>,&local_d8,pRVar3,
                 (basic_string_view<char,_std::char_traits<char>_> *)&format_3,args_2);
    }
    else {
      local_f0 = "\n        % %{};";
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_100,"\n        % %{};");
      pRVar3 = method_signature::return_signature(signature);
      local_110 = method_signature::return_param_name(signature);
      writer_base<cppwinrt::writer>::
      write<winmd::reader::RetTypeSig,std::basic_string_view<char,std::char_traits<char>>>
                (&w->super_writer_base<cppwinrt::writer>,&local_100,pRVar3,&local_110);
    }
  }
  return;
}

Assistant:

static void write_consume_return_type(writer& w, method_signature const& signature, bool delegate_types)
    {
        if (!signature.return_signature())
        {
            return;
        }

        auto category = get_category(signature.return_signature().Type());

        if (category == param_category::array_type)
        {
            auto format = R"(
        uint32_t %_impl_size{};
        %* %{};)";

            auto abi_guard = w.push_abi_types(true);
            auto delegate_guard = w.push_delegate_types(delegate_types);

            w.write(format,
                signature.return_param_name(),
                signature.return_signature(),
                signature.return_param_name());
        }
        else if (category == param_category::object_type || category == param_category::string_type)
        {
            auto format = "\n        void* %{};";
            w.write(format, signature.return_param_name());
        }
        else if (category == param_category::generic_type)
        {
            auto format = "\n        % %{ empty_value<%>() };";
            w.write(format, signature.return_signature(), signature.return_param_name(), signature.return_signature());
        }
        else
        {
            auto format = "\n        % %{};";
            w.write(format, signature.return_signature(), signature.return_param_name());
        }
    }